

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

HelicsCore helicsCreateCoreFromArgs(char *type,char *name,int argc,char **argv,HelicsError *err)

{
  string_view newError;
  char *pcVar1;
  pointer pCVar2;
  element_type *this;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int *in_R8;
  void *retcore;
  int ii;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  __single_object core;
  CoreType coretype;
  shared_ptr<helics::Core> *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  undefined1 *__n;
  MasterObjectHolder *in_stack_fffffffffffffe70;
  unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>
  *in_stack_fffffffffffffe78;
  MasterObjectHolder *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe90;
  CoreType local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  pointer in_stack_ffffffffffffff00;
  CoreType in_stack_ffffffffffffff0c;
  string_view in_stack_ffffffffffffff10;
  allocator<char> local_c9 [9];
  string_view in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  CoreType local_34;
  int *local_30;
  int local_1c;
  long local_18;
  pointer local_8;
  
  if ((in_R8 == (int *)0x0) || (*in_R8 == 0)) {
    local_30 = in_R8;
    local_1c = in_EDX;
    local_18 = in_RSI;
    if (in_RDI == 0) {
      local_168 = DEFAULT;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
      local_168 = helics::core::coreTypeFromString(in_stack_ffffffffffffff40);
    }
    local_34 = local_168;
    if (local_168 == UNRECOGNIZED) {
      if (local_30 != (int *)0x0) {
        *local_30 = -4;
        this_00 = &local_58;
        getMasterHolder();
        std::__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x19eefc);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_00,(char *)in_stack_fffffffffffffe78,
                   (allocator<char> *)in_stack_fffffffffffffe70);
        std::operator+(in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40);
        std::operator+(in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40);
        std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe40);
        newError._M_str = (char *)this_00;
        newError._M_len = (size_t)in_stack_fffffffffffffe78;
        pcVar1 = MasterObjectHolder::addErrorString(in_stack_fffffffffffffe70,newError);
        *(char **)(local_30 + 2) = pcVar1;
        std::__cxx11::string::~string(in_stack_fffffffffffffe40);
        std::__cxx11::string::~string(in_stack_fffffffffffffe40);
        std::__cxx11::string::~string(in_stack_fffffffffffffe40);
        std::allocator<char>::~allocator(local_c9);
        std::shared_ptr<MasterObjectHolder>::~shared_ptr((shared_ptr<MasterObjectHolder> *)0x19effb)
        ;
      }
      local_8 = (pointer)0x0;
    }
    else {
      __n = &stack0xffffffffffffff18;
      std::make_unique<helics::CoreObject>();
      pCVar2 = std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::
               operator->((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>
                           *)0x19f0c9);
      pCVar2->valid = 0x378424ec;
      pvVar3 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&stack0xffffffffffffff00;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x19f0e2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve(pvVar3,(size_type)__n);
      while (local_118.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_1c + -1,
            0 < local_118.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*const&>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffe50,(char **)in_stack_fffffffffffffe48);
        local_1c = local_118.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      }
      if (local_18 == 0) {
        std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe40);
      }
      else {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      helics::CoreFactory::FindOrCreate
                (in_stack_ffffffffffffff0c,in_stack_ffffffffffffff10,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffff00);
      std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::operator->
                ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)
                 0x19f202);
      pvVar3 = &local_118;
      std::shared_ptr<helics::Core>::operator=
                ((shared_ptr<helics::Core> *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      std::shared_ptr<helics::Core>::~shared_ptr((shared_ptr<helics::Core> *)0x19f221);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(pvVar3);
      pCVar2 = std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::get
                         ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>
                           *)in_stack_fffffffffffffe40);
      getMasterHolder();
      this = std::__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x19f256);
      std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::unique_ptr
                ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)this,
                 (unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)
                 in_stack_fffffffffffffe38);
      MasterObjectHolder::addCore(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::~unique_ptr
                ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)this);
      std::shared_ptr<MasterObjectHolder>::~shared_ptr((shared_ptr<MasterObjectHolder> *)0x19f297);
      local_8 = pCVar2;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(pvVar3);
      std::unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_>::~unique_ptr
                ((unique_ptr<helics::CoreObject,_std::default_delete<helics::CoreObject>_> *)this);
    }
  }
  else {
    local_8 = (pointer)0x0;
  }
  return local_8;
}

Assistant:

HelicsCore helicsCreateCoreFromArgs(const char* type, const char* name, int argc, const char* const* argv, HelicsError* err)
{
    if ((err != nullptr) && (err->error_code != 0)) {
        return nullptr;
    }
    const helics::CoreType coretype = (type != nullptr) ? helics::core::coreTypeFromString(type) : helics::CoreType::DEFAULT;

    if (coretype == helics::CoreType::UNRECOGNIZED) {
        if (err != nullptr) {
            err->error_code = HELICS_ERROR_INVALID_ARGUMENT;
            err->message = getMasterHolder()->addErrorString(std::string("core type ") + type + " is not recognized");
        }
        return nullptr;
    }
    auto core = std::make_unique<helics::CoreObject>();
    try {
        core->valid = gCoreValidationIdentifier;
        std::vector<std::string> args;
        args.reserve(static_cast<size_t>(argc) - 1);
        for (int ii = argc - 1; ii > 0; ii--) {
            args.emplace_back(argv[ii]);
        }
        core->coreptr = helics::CoreFactory::FindOrCreate(coretype, AS_STRING_VIEW(name), args);

        auto* retcore = reinterpret_cast<HelicsCore>(core.get());
        getMasterHolder()->addCore(std::move(core));

        return retcore;
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
}